

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

void zdd_fprintdot(FILE *out,ZDD zdd)

{
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  ZDD zdd_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"digraph \"DD\" {\n");
  fprintf((FILE *)out,"graph [dpi = 300];\n");
  fprintf((FILE *)out,"center = true;\n");
  fprintf((FILE *)out,"edge [dir = forward];\n");
  fprintf((FILE *)out,"root [style=invis];\n");
  uVar2 = ZDD_GETINDEX(zdd);
  iVar1 = ZDD_HASMARK(zdd);
  pcVar3 = "none";
  if (iVar1 != 0) {
    pcVar3 = "dot";
  }
  fprintf((FILE *)out,"root -> %lu [style=solid dir=both arrowtail=%s];\n",uVar2,pcVar3);
  zdd_fprintdot_rec(out,zdd);
  zdd_unmark_rec(zdd);
  fprintf((FILE *)out,"}\n");
  return;
}

Assistant:

void
zdd_fprintdot(FILE *out, ZDD zdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");
    fprintf(out, "root [style=invis];\n");
    fprintf(out, "root -> %" PRIu64 " [style=solid dir=both arrowtail=%s];\n",
            ZDD_GETINDEX(zdd), ZDD_HASMARK(zdd) ? "dot" : "none");

    zdd_fprintdot_rec(out, zdd);
    zdd_unmark_rec(zdd);

    fprintf(out, "}\n");
}